

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int yaml_parser_parse_flow_sequence_entry(yaml_parser_t *parser,yaml_event_t *event,int first)

{
  yaml_mark_t **ppyVar1;
  yaml_mark_t *pyVar2;
  yaml_parser_state_t *pyVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  int iVar10;
  yaml_token_t *pyVar11;
  
  if (first != 0) {
    if ((parser->token_available == 0) &&
       (iVar10 = yaml_parser_fetch_more_tokens(parser), iVar10 == 0)) {
      pyVar11 = (yaml_token_t *)0x0;
    }
    else {
      pyVar11 = (parser->tokens).head;
    }
    if (((parser->marks).top == (parser->marks).end) &&
       (iVar10 = yaml_stack_extend(&(parser->marks).start,&(parser->marks).top,&(parser->marks).end)
       , iVar10 == 0)) goto LAB_001b1325;
    pyVar2 = (parser->marks).top;
    (parser->marks).top = pyVar2 + 1;
    pyVar2->column = (pyVar11->start_mark).column;
    sVar4 = (pyVar11->start_mark).line;
    pyVar2->index = (pyVar11->start_mark).index;
    pyVar2->line = sVar4;
    parser->token_available = 0;
    parser->tokens_parsed = parser->tokens_parsed + 1;
    pyVar11 = (parser->tokens).head;
    parser->stream_end_produced = (uint)(pyVar11->type == YAML_STREAM_END_TOKEN);
    (parser->tokens).head = pyVar11 + 1;
  }
  if ((parser->token_available == 0) &&
     (iVar10 = yaml_parser_fetch_more_tokens(parser), iVar10 == 0)) {
    pyVar11 = (yaml_token_t *)0x0;
  }
  else {
    pyVar11 = (parser->tokens).head;
  }
  if (pyVar11 == (yaml_token_t *)0x0) {
    return 0;
  }
  if (pyVar11->type != YAML_FLOW_SEQUENCE_END_TOKEN) {
    if (first == 0) {
      if (pyVar11->type != YAML_FLOW_ENTRY_TOKEN) {
        pyVar2 = (parser->marks).top;
        (parser->marks).top = pyVar2 + -1;
        sVar4 = (pyVar11->start_mark).column;
        sVar6 = (pyVar11->start_mark).index;
        sVar7 = (pyVar11->start_mark).line;
        sVar8 = pyVar2[-1].index;
        sVar9 = pyVar2[-1].line;
        sVar5 = pyVar2[-1].column;
        parser->error = YAML_PARSER_ERROR;
        parser->context = "while parsing a flow sequence";
        (parser->context_mark).index = sVar8;
        (parser->context_mark).line = sVar9;
        (parser->context_mark).column = sVar5;
        parser->problem = "did not find expected \',\' or \']\'";
        (parser->problem_mark).index = sVar6;
        (parser->problem_mark).line = sVar7;
        (parser->problem_mark).column = sVar4;
        return 0;
      }
      parser->token_available = 0;
      parser->tokens_parsed = parser->tokens_parsed + 1;
      pyVar11 = (parser->tokens).head;
      parser->stream_end_produced = (uint)(pyVar11->type == YAML_STREAM_END_TOKEN);
      (parser->tokens).head = pyVar11 + 1;
      iVar10 = yaml_parser_fetch_more_tokens(parser);
      if (iVar10 == 0) {
        pyVar11 = (yaml_token_t *)0x0;
      }
      else {
        pyVar11 = (parser->tokens).head;
      }
      if (pyVar11 == (yaml_token_t *)0x0) {
        return 0;
      }
    }
    if (pyVar11->type != YAML_FLOW_SEQUENCE_END_TOKEN) {
      if (pyVar11->type != YAML_KEY_TOKEN) {
        if (((parser->states).top != (parser->states).end) ||
           (iVar10 = yaml_stack_extend(&(parser->states).start,&(parser->states).top,
                                       &(parser->states).end), iVar10 != 0)) {
          pyVar3 = (parser->states).top;
          (parser->states).top = pyVar3 + 1;
          *pyVar3 = YAML_PARSE_FLOW_SEQUENCE_ENTRY_STATE;
          iVar10 = yaml_parser_parse_node(parser,event,0,0);
          return iVar10;
        }
LAB_001b1325:
        parser->error = YAML_MEMORY_ERROR;
        return 0;
      }
      parser->state = YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_KEY_STATE;
      *(undefined8 *)event = 0;
      (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
      (event->end_mark).index = 0;
      (event->end_mark).line = 0;
      (event->start_mark).line = 0;
      (event->start_mark).column = 0;
      *(undefined8 *)((long)&event->data + 0x28) = 0;
      (event->start_mark).index = 0;
      (event->data).scalar.length = 0;
      *(undefined8 *)((long)&event->data + 0x20) = 0;
      (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
      (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
      (event->end_mark).column = 0;
      event->type = YAML_MAPPING_START_EVENT;
      sVar4 = (pyVar11->start_mark).line;
      (event->start_mark).index = (pyVar11->start_mark).index;
      (event->start_mark).line = sVar4;
      (event->start_mark).column = (pyVar11->start_mark).column;
      sVar4 = (pyVar11->end_mark).line;
      (event->end_mark).index = (pyVar11->end_mark).index;
      (event->end_mark).line = sVar4;
      (event->end_mark).column = (pyVar11->end_mark).column;
      (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
      (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
      (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x200000001;
      goto LAB_001b1193;
    }
  }
  pyVar3 = (parser->states).top;
  (parser->states).top = pyVar3 + -1;
  parser->state = pyVar3[-1];
  ppyVar1 = &(parser->marks).top;
  *ppyVar1 = *ppyVar1 + -1;
  *(undefined8 *)event = 0;
  (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
  (event->end_mark).index = 0;
  (event->end_mark).line = 0;
  (event->start_mark).line = 0;
  (event->start_mark).column = 0;
  *(undefined8 *)((long)&event->data + 0x28) = 0;
  (event->start_mark).index = 0;
  (event->data).scalar.length = 0;
  *(undefined8 *)((long)&event->data + 0x20) = 0;
  (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
  (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
  (event->end_mark).column = 0;
  event->type = YAML_SEQUENCE_END_EVENT;
  (event->start_mark).column = (pyVar11->start_mark).column;
  sVar4 = (pyVar11->start_mark).line;
  (event->start_mark).index = (pyVar11->start_mark).index;
  (event->start_mark).line = sVar4;
  (event->end_mark).column = (pyVar11->end_mark).column;
  sVar4 = (pyVar11->end_mark).line;
  (event->end_mark).index = (pyVar11->end_mark).index;
  (event->end_mark).line = sVar4;
LAB_001b1193:
  parser->token_available = 0;
  parser->tokens_parsed = parser->tokens_parsed + 1;
  pyVar11 = (parser->tokens).head;
  parser->stream_end_produced = (uint)(pyVar11->type == YAML_STREAM_END_TOKEN);
  (parser->tokens).head = pyVar11 + 1;
  return 1;
}

Assistant:

static int
yaml_parser_parse_flow_sequence_entry(yaml_parser_t *parser,
        yaml_event_t *event, int first)
{
    yaml_token_t *token;

    if (first) {
        token = PEEK_TOKEN(parser);
        if (!PUSH(parser, parser->marks, token->start_mark))
            return 0;
        SKIP_TOKEN(parser);
    }

    token = PEEK_TOKEN(parser);
    if (!token) return 0;

    if (token->type != YAML_FLOW_SEQUENCE_END_TOKEN)
    {
        if (!first) {
            if (token->type == YAML_FLOW_ENTRY_TOKEN) {
                SKIP_TOKEN(parser);
                token = PEEK_TOKEN(parser);
                if (!token) return 0;
            }
            else {
                return yaml_parser_set_parser_error_context(parser,
                        "while parsing a flow sequence", POP(parser, parser->marks),
                        "did not find expected ',' or ']'", token->start_mark);
            }
        }

        if (token->type == YAML_KEY_TOKEN) {
            parser->state = YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_KEY_STATE;
            MAPPING_START_EVENT_INIT(*event, NULL, NULL,
                    1, YAML_FLOW_MAPPING_STYLE,
                    token->start_mark, token->end_mark);
            SKIP_TOKEN(parser);
            return 1;
        }

        else if (token->type != YAML_FLOW_SEQUENCE_END_TOKEN) {
            if (!PUSH(parser, parser->states,
                        YAML_PARSE_FLOW_SEQUENCE_ENTRY_STATE))
                return 0;
            return yaml_parser_parse_node(parser, event, 0, 0);
        }
    }

    parser->state = POP(parser, parser->states);
    (void)POP(parser, parser->marks);
    SEQUENCE_END_EVENT_INIT(*event, token->start_mark, token->end_mark);
    SKIP_TOKEN(parser);
    return 1;
}